

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::A_formatter<spdlog::details::null_scoped_padder>::format
          (A_formatter<spdlog::details::null_scoped_padder> *this,log_msg *param_2,tm *tm_time,
          memory_buf_t *dest)

{
  string_view_t view;
  size_t sVar1;
  memory_buf_t *in_RCX;
  basic_string_view<char> *in_RDI;
  null_scoped_padder p;
  string_view_t field_value;
  char *in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffc8;
  char *in_stack_ffffffffffffffd0;
  memory_buf_t *local_28;
  
  std::array<const_char_*,_7UL>::operator[]
            ((array<const_char_*,_7UL> *)in_RDI,(size_type)in_stack_ffffffffffffffa8);
  ::fmt::v6::basic_string_view<char>::basic_string_view(in_RDI,in_stack_ffffffffffffffa8);
  sVar1 = ::fmt::v6::basic_string_view<char>::size
                    ((basic_string_view<char> *)&stack0xffffffffffffffd0);
  null_scoped_padder::null_scoped_padder
            ((null_scoped_padder *)&stack0xffffffffffffffcf,sVar1,(padding_info *)&in_RDI->size_,
             in_RCX);
  view.size_ = (size_t)in_stack_ffffffffffffffd0;
  view.data_ = in_stack_ffffffffffffffc8;
  fmt_helper::append_string_view(view,local_28);
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, memory_buf_t &dest) override
    {
        string_view_t field_value{full_days[static_cast<size_t>(tm_time.tm_wday)]};
        ScopedPadder p(field_value.size(), padinfo_, dest);
        fmt_helper::append_string_view(field_value, dest);
    }